

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGen.cxx
# Opt level: O1

string_view cmQtAutoGen::GeneratorName(GenT genType)

{
  char *pcVar1;
  string_view sVar2;
  
  if (genType - MOC < 3) {
    pcVar1 = &DAT_007ef1c8 + *(int *)(&DAT_007ef1c8 + (ulong)(genType - MOC) * 4);
  }
  else {
    pcVar1 = "AutoGen";
  }
  sVar2._M_str = pcVar1;
  sVar2._M_len = 7;
  return sVar2;
}

Assistant:

cm::string_view cmQtAutoGen::GeneratorName(GenT genType)
{
  switch (genType) {
    case GenT::GEN:
      return "AutoGen";
    case GenT::MOC:
      return "AutoMoc";
    case GenT::UIC:
      return "AutoUic";
    case GenT::RCC:
      return "AutoRcc";
  }
  return "AutoGen";
}